

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  __uid_t _Var1;
  int iVar2;
  ixy_device *piVar3;
  char *pcVar4;
  uint8_t *puVar5;
  void *pvVar6;
  int in_ECX;
  ushort in_DX;
  ushort in_SI;
  char *in_RDI;
  stat buffer;
  char path [4096];
  ixgbe_device *dev;
  char *in_stack_00002768;
  ixgbe_device *in_stack_ffffffffffffef60;
  ixgbe_device *in_stack_ffffffffffffef80;
  char local_1018 [416];
  int in_stack_fffffffffffff188;
  int in_stack_fffffffffffff18c;
  
  _Var1 = getuid();
  if (_Var1 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x203,"ixgbe_init");
  }
  if (in_SI < 0x41) {
    if (0x40 < in_DX) {
      fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x209,"ixgbe_init",(ulong)in_DX,0x40);
      abort();
    }
    piVar3 = (ixy_device *)malloc(0x88);
    pcVar4 = strdup(in_RDI);
    piVar3->pci_addr = pcVar4;
    snprintf(local_1018,0x1000,"/sys/bus/pci/devices/%s/iommu_group",in_RDI);
    iVar2 = stat(local_1018,(stat *)&stack0xffffffffffffef58);
    piVar3->vfio = iVar2 == 0;
    if ((piVar3->vfio & 1U) != 0) {
      iVar2 = vfio_init(in_stack_00002768);
      piVar3->vfio_fd = iVar2;
      if (piVar3->vfio_fd < 0) {
        fprintf(_stderr,"[ERROR] %s:%d %s(): could not initialize the IOMMU for device %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
                ,0x21a,"ixgbe_init",in_RDI);
        abort();
      }
    }
    piVar3->driver_name = driver_name;
    piVar3->num_rx_queues = in_SI;
    piVar3->num_tx_queues = in_DX;
    piVar3->rx_batch = ixgbe_rx_batch;
    piVar3->tx_batch = ixgbe_tx_batch;
    piVar3->read_stats = ixgbe_read_stats;
    piVar3->set_promisc = ixgbe_set_promisc;
    piVar3->get_link_speed = ixgbe_get_link_speed;
    piVar3->get_mac_addr = ixgbe_get_mac_addr;
    piVar3->set_mac_addr = ixgbe_set_mac_addr;
    (piVar3->interrupts).interrupts_enabled = in_ECX != 0;
    (piVar3->interrupts).itr_rate = 0x28;
    (piVar3->interrupts).timeout_ms = in_ECX;
    if (((piVar3->vfio & 1U) == 0) && (in_ECX != 0)) {
      fprintf(_stderr,
              "[WARN ] %s:%d %s(): Interrupts requested but VFIO not available: Disabling Interrupts!\n"
              ,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
              ,0x22d,"ixgbe_init");
      (piVar3->interrupts).interrupts_enabled = false;
    }
    if ((piVar3->vfio & 1U) == 0) {
      fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via pci file...\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x238,"ixgbe_init");
      puVar5 = pci_map_resource((char *)path._1984_8_);
      piVar3[1].pci_addr = (char *)puVar5;
    }
    else {
      fprintf(_stderr,"[DEBUG] %s:%d %s(): mapping BAR0 region via VFIO...\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x233,"ixgbe_init");
      puVar5 = vfio_map_region(in_stack_fffffffffffff18c,in_stack_fffffffffffff188);
      piVar3[1].pci_addr = (char *)puVar5;
      setup_interrupts(in_stack_ffffffffffffef60);
    }
    pcVar4 = (char *)calloc((ulong)in_SI,0x8018);
    piVar3[1].driver_name = pcVar4;
    pvVar6 = calloc((ulong)in_DX,0x8010);
    *(void **)&piVar3[1].num_rx_queues = pvVar6;
    reset_and_init(in_stack_ffffffffffffef80);
    return piVar3;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x206,"ixgbe_init",(ulong)in_SI,0x40);
  abort();
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}

	// Allocate memory for the ixgbe device that will be returned
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);

	// Check if we want the VFIO stuff
	// This is done by checking if the device is in an IOMMU group.
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/iommu_group", pci_addr);
	struct stat buffer;
	dev->ixy.vfio = stat(path, &buffer) == 0;
	if (dev->ixy.vfio) {
		// initialize the IOMMU for this device
		dev->ixy.vfio_fd = vfio_init(pci_addr);
		if (dev->ixy.vfio_fd < 0) {
			error("could not initialize the IOMMU for device %s", pci_addr);
		}
	}
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->ixy.get_mac_addr = ixgbe_get_mac_addr;
	dev->ixy.set_mac_addr = ixgbe_set_mac_addr;
	dev->ixy.interrupts.interrupts_enabled = interrupt_timeout != 0;
	// 0x028 (10ys) => 97600 INT/s
	dev->ixy.interrupts.itr_rate = 0x028;
	dev->ixy.interrupts.timeout_ms = interrupt_timeout;

	if (!dev->ixy.vfio && interrupt_timeout != 0) {
		warn("Interrupts requested but VFIO not available: Disabling Interrupts!");
		dev->ixy.interrupts.interrupts_enabled = false;
	}

	// Map BAR0 region
	if (dev->ixy.vfio) {
		debug("mapping BAR0 region via VFIO...");
		dev->addr = vfio_map_region(dev->ixy.vfio_fd, VFIO_PCI_BAR0_REGION_INDEX);
		// initialize interrupts for this device
		setup_interrupts(dev);
	} else {
		debug("mapping BAR0 region via pci file...");
		dev->addr = pci_map_resource(pci_addr);
	}
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}